

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_compression.c
# Opt level: O1

int build_compressed(st_ptls_compressed_certificate_entry_t *entry,ptls_iovec_t *certificates,
                    size_t num_certificates,ptls_iovec_t ocsp_status)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  ptls_buffer_t uncompressed;
  ptls_buffer_t local_48;
  
  local_48.base = "";
  local_48.capacity = 0;
  local_48.off = 0;
  local_48.is_allocated = 0;
  iVar2 = ptls_build_certificate_message
                    (&local_48,(ptls_iovec_t)ZEXT816(0),certificates,num_certificates,ocsp_status);
  sVar1 = local_48.off;
  if (iVar2 == 0) {
    entry->uncompressed_length = (uint32_t)local_48.off;
    (entry->bytes).len = local_48.off - 1;
    puVar4 = (uint8_t *)malloc(local_48.off - 1);
    (entry->bytes).base = puVar4;
    if (puVar4 == (uint8_t *)0x0) {
      iVar2 = 0x201;
    }
    else {
      iVar3 = BrotliEncoderCompress(0xb,0x16,0,sVar1,local_48.base,&(entry->bytes).len,puVar4);
      iVar2 = 0x208;
      if (iVar3 == 1) {
        iVar2 = 0;
      }
    }
  }
  if (iVar2 != 0) {
    free((entry->bytes).base);
    *(undefined8 *)entry = 0;
    (entry->bytes).base = (uint8_t *)0x0;
    (entry->bytes).len = 0;
  }
  ptls_buffer__release_memory(&local_48);
  return iVar2;
}

Assistant:

static int build_compressed(struct st_ptls_compressed_certificate_entry_t *entry, ptls_iovec_t *certificates,
                            size_t num_certificates, ptls_iovec_t ocsp_status)
{
    ptls_buffer_t uncompressed;
    int ret;

    ptls_buffer_init(&uncompressed, "", 0);

    /* build uncompressed */
    if ((ret = ptls_build_certificate_message(&uncompressed, ptls_iovec_init(NULL, 0), certificates, num_certificates,
                                              ocsp_status)) != 0)
        goto Exit;
    entry->uncompressed_length = (uint32_t)uncompressed.off;

    /* compress */
    entry->bytes.len = uncompressed.off - 1;
    if ((entry->bytes.base = malloc(entry->bytes.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (BrotliEncoderCompress(BROTLI_MAX_QUALITY, BROTLI_DEFAULT_WINDOW, BROTLI_MODE_GENERIC, uncompressed.off, uncompressed.base,
                              &entry->bytes.len, entry->bytes.base) != BROTLI_TRUE) {
        ret = PTLS_ERROR_COMPRESSION_FAILURE;
        goto Exit;
    }

    ret = 0;

Exit:
    if (ret != 0) {
        free(entry->bytes.base);
        *entry = (struct st_ptls_compressed_certificate_entry_t){0};
    }
    ptls_buffer_dispose(&uncompressed);
    return ret;
}